

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::setInternalSymbol
          (NonAnsiPortListBuilder *this,ValueSymbol *symbol,DeclaratorSyntax *decl,
          DataTypeSyntax *dataType,PortInfo *info)

{
  Symbol *pSVar1;
  ValueSymbol *local_30;
  
  (symbol->super_Symbol).originatingSyntax = &decl->super_SyntaxNode;
  Symbol::setAttributes(&symbol->super_Symbol,this->scope,info->attrs);
  local_30 = symbol;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
  emplace_back<slang::ast::ValueSymbol*,slang::ast::Symbol_const*&>
            ((SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *)
             this->implicitMembers,&local_30,&info->insertionPoint);
  info->internalSymbol = &symbol->super_Symbol;
  if (dataType == (DataTypeSyntax *)0x0) {
    if ((decl->dimensions).
        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
        _M_extent_value != 0) {
      DeclaredType::setDimensionSyntax(&symbol->declaredType,&decl->dimensions);
    }
  }
  else {
    ValueSymbol::setDeclaredType(symbol,dataType,&decl->dimensions);
  }
  pSVar1 = info->insertionPoint;
  if (pSVar1 != (Symbol *)0x0) {
    *(SymbolIndex *)&(symbol->declaredType).field_0x3c =
         *(SymbolIndex *)&(symbol->declaredType).field_0x3c & 0xc0000000 |
         pSVar1->indexInScope & 0x3fffffff;
  }
  return;
}

Assistant:

void setInternalSymbol(ValueSymbol& symbol, const DeclaratorSyntax& decl,
                           const DataTypeSyntax* dataType, PortInfo& info) {
        symbol.setSyntax(decl);
        symbol.setAttributes(scope, info.attrs);
        implicitMembers.emplace_back(&symbol, info.insertionPoint);
        info.internalSymbol = &symbol;

        if (dataType)
            symbol.setDeclaredType(*dataType, decl.dimensions);
        else if (!decl.dimensions.empty())
            symbol.getDeclaredType()->setDimensionSyntax(decl.dimensions);

        if (info.insertionPoint)
            symbol.getDeclaredType()->setOverrideIndex(info.insertionPoint->getIndex());
    }